

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase_p.h
# Opt level: O2

void __thiscall QtFontFamily::QtFontFamily(QtFontFamily *this,QString *n)

{
  *(byte *)this = *(byte *)this & 0xf8;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&(this->name).d,&n->d);
  this->foundries = (QtFontFoundry **)0x0;
  (this->aliases).d.d = (Data *)0x0;
  (this->aliases).d.ptr = (QString *)0x0;
  *(undefined8 *)((long)&(this->aliases).d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->aliases).d.size + 4) = 0;
  this->writingSystems[0] = '\0';
  this->writingSystems[1] = '\0';
  this->writingSystems[2] = '\0';
  this->writingSystems[3] = '\0';
  this->writingSystems[4] = '\0';
  this->writingSystems[5] = '\0';
  this->writingSystems[6] = '\0';
  this->writingSystems[7] = '\0';
  this->writingSystems[8] = '\0';
  this->writingSystems[9] = '\0';
  this->writingSystems[10] = '\0';
  this->writingSystems[0xb] = '\0';
  this->writingSystems[0xc] = '\0';
  this->writingSystems[0xd] = '\0';
  this->writingSystems[0xe] = '\0';
  this->writingSystems[0xf] = '\0';
  this->writingSystems[0x10] = '\0';
  this->writingSystems[0x11] = '\0';
  this->writingSystems[0x12] = '\0';
  this->writingSystems[0x13] = '\0';
  this->writingSystems[0x14] = '\0';
  this->writingSystems[0x15] = '\0';
  this->writingSystems[0x16] = '\0';
  this->writingSystems[0x17] = '\0';
  this->writingSystems[0x18] = '\0';
  this->writingSystems[0x19] = '\0';
  this->writingSystems[0x1a] = '\0';
  this->writingSystems[0x1b] = '\0';
  this->writingSystems[0x1c] = '\0';
  this->writingSystems[0x1d] = '\0';
  this->writingSystems[0x1e] = '\0';
  this->writingSystems[0x1f] = '\0';
  this->writingSystems[0x20] = '\0';
  this->writingSystems[0x21] = '\0';
  return;
}

Assistant:

QtFontFamily(const QString &n)
        :
        populated(false),
        fixedPitch(false),
        colorFont(false),
        name(n), count(0), foundries(nullptr)
    {
        memset(writingSystems, 0, sizeof(writingSystems));
    }